

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

double cert::sqrt(double __x)

{
  float b;
  float fVar1;
  bool bVar2;
  float fVar3;
  undefined4 local_14;
  
  fVar3 = SUB84(__x,0);
  local_14 = NAN;
  if ((0.0 <= fVar3) && (fVar3 != INFINITY)) {
    fVar1 = fVar3;
    b = 0.0;
    while( true ) {
      local_14 = fVar1;
      bVar2 = nearly_equal(local_14,b,1.5258789e-05,1.1754944e-38);
      if (bVar2) break;
      fVar1 = (fVar3 / local_14 + local_14) * 0.5;
      b = local_14;
    }
  }
  return (double)(ulong)(uint)local_14;
}

Assistant:

constexpr float sqrt (float x)
{
	if (0 <= x && x < std::numeric_limits<double>::infinity ())
	{
		double curr = x;
		double prev = 0;
		while (!nearly_equal (curr, prev))
		{
			prev = curr;
			curr = 0.5 * (curr + x / curr);
		}
		return curr;
	}
	else
	{
		return std::numeric_limits<double>::quiet_NaN ();
	}
}